

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O0

set<Addr,_std::less<Addr>,_std::allocator<Addr>_> * __thiscall
BpTree<float>::FindGreater
          (set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *__return_storage_ptr__,
          BpTree<float> *this,float k,bool EQ)

{
  Addr p;
  reference pvVar1;
  reference pvVar2;
  bool bVar3;
  Addr local_94;
  Addr Cp;
  int pos;
  int i;
  IndexNode<float> C;
  bool EQ_local;
  float k_local;
  BpTree<float> *this_local;
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *ret;
  
  C.self.BlockNum._3_1_ = EQ;
  C.self.FileOff = (int)k;
  IndexNode<float>::IndexNode((IndexNode<float> *)&i,this->N);
  std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::set(__return_storage_ptr__);
  if ((this->RootAddr).FileOff != -1) {
    if ((C.self.BlockNum._3_1_ & 1) == 0) {
      Cp.BlockNum = FindNextKey(this,(float)C.self.FileOff,&local_94);
    }
    else {
      Cp.BlockNum = FindFirstKey(this,(float)C.self.FileOff,&local_94);
    }
    if (Cp.BlockNum == -1) {
      std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::clear(__return_storage_ptr__);
    }
    else {
      FindNode(this,local_94,(IndexNode<float> *)&i);
      while( true ) {
        Cp.FileOff = Cp.BlockNum;
        while( true ) {
          bVar3 = false;
          if (Cp.FileOff < this->N + -1) {
            pvVar1 = std::vector<char,_std::allocator<char>_>::operator[]
                               ((vector<char,_std::allocator<char>_> *)
                                &C.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,(long)Cp.FileOff);
            bVar3 = *pvVar1 == '1';
          }
          if (!bVar3) break;
          pvVar2 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                             ((vector<Addr,_std::allocator<Addr>_> *)
                              &C.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               field_0x10,(long)Cp.FileOff);
          std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::insert
                    (__return_storage_ptr__,pvVar2);
          Cp.FileOff = Cp.FileOff + 1;
        }
        if (((Cp.FileOff == this->N + -1) ||
            (pvVar1 = std::vector<char,_std::allocator<char>_>::operator[]
                                ((vector<char,_std::allocator<char>_> *)
                                 &C.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,(long)Cp.FileOff),
            *pvVar1 == '0')) &&
           (pvVar2 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                               ((vector<Addr,_std::allocator<Addr>_> *)
                                &C.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 field_0x10,(long)(this->N + -1)), pvVar2->FileOff == -1)) break;
        if ((Cp.FileOff == this->N + -1) ||
           (pvVar1 = std::vector<char,_std::allocator<char>_>::operator[]
                               ((vector<char,_std::allocator<char>_> *)
                                &C.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,(long)Cp.FileOff),
           *pvVar1 == '0')) {
          Cp.BlockNum = 0;
          pvVar2 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                             ((vector<Addr,_std::allocator<Addr>_> *)
                              &C.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               field_0x10,(long)(this->N + -1));
          p.BlockNum = pvVar2->BlockNum;
          p.FileOff = pvVar2->FileOff;
          FindNode(this,p,(IndexNode<float> *)&i);
        }
      }
    }
  }
  IndexNode<float>::~IndexNode((IndexNode<float> *)&i);
  return __return_storage_ptr__;
}

Assistant:

set<Addr> BpTree<K>::FindGreater(K k, bool EQ) {
	IndexNode<K> C(N);
	set<Addr> ret;
	int i, pos;
	Addr Cp;
	if (this->RootAddr.FileOff == -1)
		return ret;
	if (EQ == false) {
		pos = this->FindNextKey(k, Cp);
	}
	else {
		pos = this->FindFirstKey(k, Cp);
	}
    if(pos == -1){
        ret.clear();
        return ret;
    }
	this->FindNode(Cp, C);
	while (1) {
		for (i = pos; i < N - 1 && C.v[i] == '1'; i++) {
			ret.insert(C.p[i]);
		}
		if ((i == N - 1 || C.v[i] == '0') && C.p[N - 1].FileOff == -1) {
			break;
		}
		else if (i == N - 1 || C.v[i] == '0') {
			pos = 0;
			this->FindNode(C.p[N - 1], C);
		}
	}
	return ret;
}